

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strerror.cc
# Opt level: O3

string * __thiscall
absl::lts_20250127::base_internal::StrError_abi_cxx11_
          (string *__return_storage_ptr__,base_internal *this,int errnum)

{
  int iVar1;
  pointer pcVar2;
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_135UL>
  *paVar3;
  int iVar4;
  int *piVar5;
  int extraout_EDX;
  int errnum_00;
  int extraout_EDX_00;
  int extraout_EDX_01;
  
  piVar5 = __errno_location();
  iVar1 = *piVar5;
  errnum_00 = extraout_EDX;
  if (StrError[abi:cxx11](int)::table_abi_cxx11_ == '\0') {
    iVar4 = __cxa_guard_acquire(&StrError[abi:cxx11](int)::table_abi_cxx11_);
    errnum_00 = extraout_EDX_00;
    if (iVar4 != 0) {
      StrError[abi:cxx11](int)::table_abi_cxx11_ =
           (anonymous_namespace)::NewStrErrorTable_abi_cxx11_();
      __cxa_guard_release(&StrError[abi:cxx11](int)::table_abi_cxx11_);
      errnum_00 = extraout_EDX_01;
    }
  }
  paVar3 = StrError[abi:cxx11](int)::table_abi_cxx11_;
  if ((uint)this < 0x87) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = paVar3->_M_elems[(ulong)this & 0xffffffff]._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar2,
               pcVar2 + paVar3->_M_elems[(ulong)this & 0xffffffff]._M_string_length);
  }
  else {
    (anonymous_namespace)::StrErrorInternal_abi_cxx11_
              (__return_storage_ptr__,(_anonymous_namespace_ *)((ulong)this & 0xffffffff),errnum_00)
    ;
  }
  *piVar5 = iVar1;
  return __return_storage_ptr__;
}

Assistant:

std::string StrError(int errnum) {
  absl::base_internal::ErrnoSaver errno_saver;
  static const auto* table = NewStrErrorTable();
  if (errnum >= 0 && static_cast<size_t>(errnum) < table->size()) {
    return (*table)[static_cast<size_t>(errnum)];
  }
  return StrErrorInternal(errnum);
}